

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

vector<AEntity_*,_std::allocator<AEntity_*>_> * __thiscall
Api::getBoardPlayer(Api *this,int player,bool verbose)

{
  Player *pPVar1;
  vector<AEntity_*,_std::allocator<AEntity_*>_> *pvVar2;
  ostream *poVar3;
  ACard *this_00;
  undefined3 in_register_00000011;
  ulong uVar4;
  string local_50;
  
  pPVar1 = GameManager::get_player(&this->_game);
  pvVar2 = Player::get_board(pPVar1 + player);
  if (CONCAT31(in_register_00000011,verbose) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Board player ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,player);
    poVar3 = std::operator<<(poVar3,": ");
    std::endl<char,std::char_traits<char>>(poVar3);
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(pvVar2->super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar2->super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar4);
      poVar3 = std::operator<<(poVar3,": ");
      this_00 = AEntity::get_reference
                          ((pvVar2->super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar4]);
      ACard::get_name_abi_cxx11_(&local_50,this_00);
      poVar3 = std::operator<<(poVar3,(string *)&local_50);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return pvVar2;
}

Assistant:

const std::vector<AEntity *> & Api::getBoardPlayer(int player, bool verbose)
{
    if (verbose){
        const std::vector<AEntity *> &board = this->_game.get_player()[player].get_board();
        std::cout << "Board player " << player << ": " << std::endl;
        for (int i = 0; i < board.size(); i += 1) {
            std::cout << i << ": " << board[i]->get_reference()->get_name() << std::endl;
        }
        return board;
    } else {
        return this->_game.get_player()[player].get_board();
    }
}